

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::NegativeCompileTime::Compile(NegativeCompileTime *this,string *source)

{
  int local_43c;
  GLchar local_438 [4];
  GLint status;
  GLchar log [1024];
  GLchar *local_30;
  char *src;
  string *psStack_20;
  GLuint sh;
  string *source_local;
  NegativeCompileTime *this_local;
  
  psStack_20 = source;
  source_local = (string *)this;
  src._4_4_ = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x91b9);
  local_30 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src._4_4_,1,&local_30,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src._4_4_);
  glu::CallLogWrapper::glGetShaderInfoLog
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src._4_4_,0x400,(GLsizei *)0x0,local_438);
  anon_unknown_0::Output("Shader Info Log:\n%s\n",local_438);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src._4_4_,0x8b81,&local_43c);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,src._4_4_);
  if (local_43c == 1) {
    anon_unknown_0::Output("Compilation should fail.\n");
  }
  return local_43c != 1;
}

Assistant:

bool Compile(const std::string& source)
	{
		const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);

		const char* const src = source.c_str();
		glShaderSource(sh, 1, &src, NULL);
		glCompileShader(sh);

		GLchar log[1024];
		glGetShaderInfoLog(sh, sizeof(log), NULL, log);
		Output("Shader Info Log:\n%s\n", log);

		GLint status;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
		glDeleteShader(sh);

		if (status == GL_TRUE)
		{
			Output("Compilation should fail.\n");
			return false;
		}
		return true;
	}